

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

shared_ptr<kratos::EventTracingStmt> __thiscall
kratos::EventTracingStmt::terminates(EventTracingStmt *this,string *transaction_name)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<kratos::EventTracingStmt> sVar2;
  _func_int **local_30;
  pointer local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  std::__cxx11::string::_M_assign((string *)(transaction_name[8].field_2._M_local_buf + 8));
  Stmt::as<kratos::EventTracingStmt>((Stmt *)&stack0xffffffffffffffd0);
  local_30[0x27] = (_func_int *)((ulong)local_30[0x27] | 2);
  sVar2 = Stmt::as<kratos::EventTracingStmt>((Stmt *)this);
  _Var1 = sVar2.super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi;
  if (local_28 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
    _Var1._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<kratos::EventTracingStmt>)
         sVar2.super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<EventTracingStmt> EventTracingStmt::terminates(
    const std::string &transaction_name) {
    return belongs(transaction_name)->terminates();
}